

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit.hpp
# Opt level: O3

string * duckdb::Bit::NumericToBit<duckdb::hugeint_t>
                   (string *__return_storage_ptr__,hugeint_t numeric)

{
  undefined1 *puVar1;
  bitstring_t *in_RCX;
  undefined1 *puVar2;
  hugeint_t numeric_00;
  uint local_30;
  undefined1 local_2c [4];
  undefined1 *local_28;
  
  puVar1 = (undefined1 *)operator_new__(0x11);
  local_30 = 0x11;
  numeric_00.upper = (int64_t)&local_30;
  numeric_00.lower = numeric.upper;
  local_28 = puVar1;
  NumericToBit<duckdb::hugeint_t>((Bit *)numeric.lower,numeric_00,in_RCX);
  puVar2 = local_28;
  if ((ulong)local_30 < 0xd) {
    puVar2 = local_2c;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,puVar2,puVar2 + local_30);
  operator_delete__(puVar1);
  return __return_storage_ptr__;
}

Assistant:

string Bit::NumericToBit(T numeric) {
	auto bit_len = sizeof(T) + 1;
	auto buffer = make_unsafe_uniq_array_uninitialized<char>(bit_len);
	bitstring_t output_str(buffer.get(), UnsafeNumericCast<uint32_t>(bit_len));
	Bit::NumericToBit(numeric, output_str);
	return output_str.GetString();
}